

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O0

int fct_clp__init(fct_clp_t *clp,fctcl_init_t *options)

{
  int iVar1;
  int local_1c;
  int ok;
  fctcl_init_t *options_local;
  fct_clp_t *clp_local;
  
  if (clp != (fct_clp_t *)0x0) {
    iVar1 = fct_nlist__init2(&clp->clo_list,8);
    if (iVar1 == 0) {
      local_1c = 0;
    }
    else if ((options == (fctcl_init_t *)0x0) ||
            (iVar1 = fct_clp__add_options(clp,options), iVar1 != 0)) {
      iVar1 = fct_nlist__init2(&clp->param_list,8);
      if (iVar1 == 0) {
        local_1c = 0;
      }
      else {
        local_1c = 1;
      }
    }
    else {
      local_1c = 0;
    }
    if (local_1c == 0) {
      fct_clp__final(clp);
    }
    return local_1c;
  }
  __assert_fail("clp != ((void*)0)",
                "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x638,
                "int fct_clp__init(fct_clp_t *, const fctcl_init_t *)");
}

Assistant:

static int
fct_clp__init(fct_clp_t *clp, fctcl_init_t const *options)
{
    int ok =0;
    FCT_ASSERT( clp != NULL );
    /* It is just much saner to manage a clone of the options. Then we know
    who is in charge of the memory. */
    ok = fct_nlist__init(&(clp->clo_list));
    if ( !ok )
    {
        goto finally;
    }
    if ( options != NULL )
    {
        ok = fct_clp__add_options(clp, options);
        if ( !ok )
        {
            goto finally;
        }
    }
    ok = fct_nlist__init(&(clp->param_list));
    if ( !ok )
    {
        goto finally;
    }
    ok =1;
finally:
    if ( !ok )
    {
        fct_clp__final(clp);
    }
    return ok;
}